

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.pb.cc
# Opt level: O0

uint8 * __thiscall
bloaty::CustomDataSource::InternalSerializeWithCachedSizesToArray
          (CustomDataSource *this,uint8 *target,EpsCopyOutputStream *stream)

{
  uint uVar1;
  uint32 uVar2;
  uint8 *target_00;
  uint8 *in_RDX;
  Regex *in_RSI;
  EpsCopyOutputStream *in_RDI;
  uint n;
  uint i;
  uint32 cached_has_bits;
  uint8 **in_stack_ffffffffffffff28;
  EpsCopyOutputStream *in_stack_ffffffffffffff30;
  uint8 *in_stack_ffffffffffffff48;
  uint32 in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffff60;
  uint uVar3;
  uint uVar4;
  Regex *this_00;
  EpsCopyOutputStream *stream_00;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 uVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  *unknown_fields;
  
  unknown_fields =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
        *)in_RDI->buffer_;
  uVar5 = 0;
  uVar4 = *(uint *)unknown_fields;
  stream_00 = in_RDI;
  if ((uVar4 & 1) != 0) {
    _internal_name_abi_cxx11_((CustomDataSource *)0x1a61b0);
    std::__cxx11::string::data();
    _internal_name_abi_cxx11_((CustomDataSource *)0x1a61c7);
    std::__cxx11::string::length();
    in_stack_ffffffffffffff48 = in_RDX;
    google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField
              ((char *)in_stack_ffffffffffffff30,(int)((ulong)in_stack_ffffffffffffff28 >> 0x20),
               (Operation)in_stack_ffffffffffffff28,(char *)0x1a61e7);
    in_RDX = in_stack_ffffffffffffff48;
    _internal_name_abi_cxx11_((CustomDataSource *)0x1a61fb);
    in_RSI = (Regex *)google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                                ((EpsCopyOutputStream *)CONCAT44(uVar4,in_stack_ffffffffffffff60),
                                 in_stack_ffffffffffffff5c,(string *)in_RDI,
                                 in_stack_ffffffffffffff48);
  }
  if ((uVar4 & 2) != 0) {
    _internal_base_data_source_abi_cxx11_((CustomDataSource *)0x1a622d);
    in_stack_ffffffffffffff30 = (EpsCopyOutputStream *)std::__cxx11::string::data();
    _internal_base_data_source_abi_cxx11_((CustomDataSource *)0x1a6244);
    std::__cxx11::string::length();
    google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField
              ((char *)in_stack_ffffffffffffff30,(int)((ulong)in_stack_ffffffffffffff28 >> 0x20),
               (Operation)in_stack_ffffffffffffff28,(char *)0x1a6264);
    _internal_base_data_source_abi_cxx11_((CustomDataSource *)0x1a6278);
    in_RSI = (Regex *)google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                                ((EpsCopyOutputStream *)CONCAT44(uVar4,in_stack_ffffffffffffff60),
                                 in_stack_ffffffffffffff5c,(string *)in_RDI,
                                 in_stack_ffffffffffffff48);
  }
  uVar3 = 0;
  uVar1 = _internal_rewrite_size((CustomDataSource *)0x1a62a6);
  for (; uVar3 < uVar1; uVar3 = uVar3 + 1) {
    google::protobuf::io::EpsCopyOutputStream::EnsureSpace
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    _internal_rewrite((CustomDataSource *)in_stack_ffffffffffffff30,
                      (int)((ulong)in_stack_ffffffffffffff28 >> 0x20));
    this_00 = in_RSI;
    uVar2 = google::protobuf::internal::WireFormatLite::MakeTag(3,WIRETYPE_LENGTH_DELIMITED);
    target_00 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArray(uVar2,(uint8 *)in_RSI)
    ;
    uVar2 = Regex::GetCachedSize((Regex *)0x1a6383);
    google::protobuf::io::CodedOutputStream::WriteVarint32ToArray(uVar2,target_00);
    in_RSI = (Regex *)Regex::InternalSerializeWithCachedSizesToArray
                                (this_00,in_RDX,(EpsCopyOutputStream *)CONCAT44(uVar4,uVar3));
  }
  if (((uint)in_RDI->buffer_end_ & 1) == 1) {
    if (((uint)in_RDI->buffer_end_ & 1) == 1) {
      google::protobuf::internal::
      InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
      ::
      PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
                ((InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                  *)&in_RDI->buffer_end_);
    }
    else {
      google::protobuf::internal::InternalMetadataWithArena::default_instance();
    }
    in_RSI = (Regex *)google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                                ((UnknownFieldSet *)unknown_fields,
                                 (uint8 *)CONCAT44(uVar5,in_stack_ffffffffffffff80),stream_00);
  }
  return (uint8 *)in_RSI;
}

Assistant:

::PROTOBUF_NAMESPACE_ID::uint8* CustomDataSource::InternalSerializeWithCachedSizesToArray(
    ::PROTOBUF_NAMESPACE_ID::uint8* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:bloaty.CustomDataSource)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional string name = 1;
  if (cached_has_bits & 0x00000001u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_name().data(), static_cast<int>(this->_internal_name().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "bloaty.CustomDataSource.name");
    target = stream->WriteStringMaybeAliased(
        1, this->_internal_name(), target);
  }

  // optional string base_data_source = 2;
  if (cached_has_bits & 0x00000002u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_base_data_source().data(), static_cast<int>(this->_internal_base_data_source().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "bloaty.CustomDataSource.base_data_source");
    target = stream->WriteStringMaybeAliased(
        2, this->_internal_base_data_source(), target);
  }

  // repeated .bloaty.Regex rewrite = 3;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_rewrite_size()); i < n; i++) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessageToArray(3, this->_internal_rewrite(i), target, stream);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::InternalSerializeUnknownFieldsToArray(
        _internal_metadata_.unknown_fields(), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:bloaty.CustomDataSource)
  return target;
}